

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O3

void __thiscall
cmExtraEclipseCDT4Generator::CreateLinksForTargets
          (cmExtraEclipseCDT4Generator *this,cmGeneratedFileStream *fout)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  bool bVar4;
  char *pcVar5;
  string *psVar6;
  cmSourceGroup *this_00;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__x;
  cmGlobalGenerator *pcVar7;
  pointer ppcVar8;
  pointer ppcVar9;
  pointer this_01;
  pointer ppcVar10;
  string source;
  string linkName2;
  string fullPath;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> files;
  string linkName;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> sFiles;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> sourceGroups;
  string linkName4;
  string local_160;
  _Hash_node_base *local_140;
  string local_138;
  string local_118;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_f8;
  cmMakefile *local_e0;
  string local_d8;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_b8;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> local_a0;
  string local_88;
  string local_68;
  pointer local_48;
  cmExtraEclipseCDT4Generator *local_40;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *local_38;
  
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"[Targets]","");
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"virtual:/virtual","");
  AppendLinkedResource(fout,&local_d8,&local_138,VirtualFolder);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  pcVar7 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  ppcVar8 = (pcVar7->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar8 !=
      (pcVar7->LocalGenerators).
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar1 = &local_118.field_2;
    local_40 = this;
    do {
      pcVar2 = (*ppcVar8)->Makefile;
      local_140 = (pcVar2->Targets)._M_h._M_before_begin._M_nxt;
      if (local_140 != (_Hash_node_base *)0x0) {
        local_38 = &pcVar2->SourceGroups;
        local_e0 = pcVar2;
        local_48 = ppcVar8;
        do {
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_138,local_d8._M_dataplus._M_p,
                     local_d8._M_dataplus._M_p + local_d8._M_string_length);
          std::__cxx11::string::append((char *)&local_138);
          if (*(uint *)&local_140[0x61]._M_nxt < 5) {
            std::__cxx11::string::append((char *)&local_138);
            std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_140[1]._M_nxt);
            local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_160,"virtual:/virtual","");
            AppendLinkedResource(fout,&local_138,&local_160,VirtualFolder);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != &local_160.field_2) {
              operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1
                             );
            }
            if (this->GenerateLinkedResources != false) {
              std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector(&local_a0,local_38)
              ;
              local_f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_118._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_118,"CMAKE_BUILD_TYPE","");
              pcVar5 = cmMakefile::GetSafeDefinition(local_e0,&local_118);
              std::__cxx11::string::string((string *)&local_160,pcVar5,(allocator *)&local_68);
              cmTarget::GetSourceFiles((cmTarget *)(local_140 + 5),&local_f8,&local_160);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != &local_160.field_2) {
                operator_delete(local_160._M_dataplus._M_p,
                                local_160.field_2._M_allocated_capacity + 1);
              }
              ppcVar9 = local_f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != paVar1) {
                operator_delete(local_118._M_dataplus._M_p,
                                local_118.field_2._M_allocated_capacity + 1);
                ppcVar9 = local_f8.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start;
              }
              for (; ppcVar9 !=
                     local_f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish; ppcVar9 = ppcVar9 + 1) {
                psVar6 = cmSourceFile::GetFullPath(*ppcVar9,(string *)0x0);
                local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
                pcVar3 = (psVar6->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_160,pcVar3,pcVar3 + psVar6->_M_string_length);
                this_00 = cmMakefile::FindSourceGroup(local_e0,local_160._M_dataplus._M_p,&local_a0)
                ;
                cmSourceGroup::AssignSource(this_00,*ppcVar9);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_160._M_dataplus._M_p != &local_160.field_2) {
                  operator_delete(local_160._M_dataplus._M_p,
                                  local_160.field_2._M_allocated_capacity + 1);
                }
              }
              this_01 = local_a0.super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              if (local_a0.super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl
                  .super__Vector_impl_data._M_start !=
                  local_a0.super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl
                  .super__Vector_impl_data._M_finish) {
                do {
                  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_160,local_138._M_dataplus._M_p,
                             local_138._M_dataplus._M_p + local_138._M_string_length);
                  std::__cxx11::string::append((char *)&local_160);
                  cmSourceGroup::GetFullName(this_01);
                  std::__cxx11::string::append((char *)&local_160);
                  local_118._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_118,"virtual:/virtual","");
                  AppendLinkedResource(fout,&local_160,&local_118,VirtualFolder);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_118._M_dataplus._M_p != paVar1) {
                    operator_delete(local_118._M_dataplus._M_p,
                                    local_118.field_2._M_allocated_capacity + 1);
                  }
                  __x = cmSourceGroup::GetSourceFiles(this_01);
                  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
                            (&local_b8,__x);
                  ppcVar10 = local_b8.
                             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  if (local_b8.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      local_b8.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
                    do {
                      psVar6 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar10);
                      pcVar3 = (psVar6->_M_dataplus)._M_p;
                      local_118._M_dataplus._M_p = (pointer)paVar1;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_118,pcVar3,pcVar3 + psVar6->_M_string_length);
                      bVar4 = cmsys::SystemTools::FileIsDirectory(&local_118);
                      if (!bVar4) {
                        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_68,local_160._M_dataplus._M_p,
                                   local_160._M_dataplus._M_p + local_160._M_string_length);
                        std::__cxx11::string::append((char *)&local_68);
                        cmsys::SystemTools::GetFilenameName(&local_88,&local_118);
                        std::__cxx11::string::_M_append
                                  ((char *)&local_68,(ulong)local_88._M_dataplus._M_p);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_88._M_dataplus._M_p != &local_88.field_2) {
                          operator_delete(local_88._M_dataplus._M_p,
                                          local_88.field_2._M_allocated_capacity + 1);
                        }
                        AppendLinkedResource(fout,&local_68,&local_118,LinkToFile);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_68._M_dataplus._M_p != &local_68.field_2) {
                          operator_delete(local_68._M_dataplus._M_p,
                                          local_68.field_2._M_allocated_capacity + 1);
                        }
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_118._M_dataplus._M_p != paVar1) {
                        operator_delete(local_118._M_dataplus._M_p,
                                        local_118.field_2._M_allocated_capacity + 1);
                      }
                      ppcVar10 = ppcVar10 + 1;
                    } while (ppcVar10 !=
                             local_b8.
                             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
                  }
                  if (local_b8.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_b8.
                                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_b8.
                                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_b8.
                                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_160._M_dataplus._M_p != &local_160.field_2) {
                    operator_delete(local_160._M_dataplus._M_p,
                                    local_160.field_2._M_allocated_capacity + 1);
                  }
                  this_01 = this_01 + 1;
                } while (this_01 !=
                         local_a0.super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
              }
              if (local_f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_f8.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_f8.
                                      super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_f8.
                                      super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector(&local_a0);
              this = local_40;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          local_140 = local_140->_M_nxt;
        } while (local_140 != (_Hash_node_base *)0x0);
        pcVar7 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
        local_140 = (_Hash_node_base *)0x0;
        ppcVar8 = local_48;
      }
      ppcVar8 = ppcVar8 + 1;
    } while (ppcVar8 !=
             (pcVar7->LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateLinksForTargets(
                                                   cmGeneratedFileStream& fout)
{
  std::string linkName = "[Targets]";
  this->AppendLinkedResource(fout, linkName, "virtual:/virtual",VirtualFolder);

  for (std::vector<cmLocalGenerator*>::const_iterator
       lgIt = this->GlobalGenerator->GetLocalGenerators().begin();
       lgIt != this->GlobalGenerator->GetLocalGenerators().end();
       ++lgIt)
    {
    cmMakefile* makefile = (*lgIt)->GetMakefile();
    const cmTargets& targets = makefile->GetTargets();

    for(cmTargets::const_iterator ti=targets.begin(); ti!=targets.end();++ti)
      {
      std::string linkName2 = linkName;
      linkName2 += "/";
      switch(ti->second.GetType())
        {
        case cmTarget::EXECUTABLE:
        case cmTarget::STATIC_LIBRARY:
        case cmTarget::SHARED_LIBRARY:
        case cmTarget::MODULE_LIBRARY:
        case cmTarget::OBJECT_LIBRARY:
          {
          const char* prefix = (ti->second.GetType()==cmTarget::EXECUTABLE ?
                                                          "[exe] " : "[lib] ");
          linkName2 += prefix;
          linkName2 += ti->first;
          this->AppendLinkedResource(fout, linkName2, "virtual:/virtual",
                                     VirtualFolder);
          if (!this->GenerateLinkedResources)
            {
            break; // skip generating the linked resources to the source files
            }
          std::vector<cmSourceGroup> sourceGroups=makefile->GetSourceGroups();
          // get the files from the source lists then add them to the groups
          cmTarget* tgt = const_cast<cmTarget*>(&ti->second);
          std::vector<cmSourceFile*> files;
          tgt->GetSourceFiles(files,
                            makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
          for(std::vector<cmSourceFile*>::const_iterator sfIt = files.begin();
              sfIt != files.end();
              sfIt++)
            {
            // Add the file to the list of sources.
            std::string source = (*sfIt)->GetFullPath();
            cmSourceGroup* sourceGroup =
                       makefile->FindSourceGroup(source.c_str(), sourceGroups);
            sourceGroup->AssignSource(*sfIt);
            }

          for(std::vector<cmSourceGroup>::iterator sgIt = sourceGroups.begin();
              sgIt != sourceGroups.end();
              ++sgIt)
            {
            std::string linkName3 = linkName2;
            linkName3 += "/";
            linkName3 += sgIt->GetFullName();
            this->AppendLinkedResource(fout, linkName3, "virtual:/virtual",
                                       VirtualFolder);

            std::vector<const cmSourceFile*> sFiles = sgIt->GetSourceFiles();
            for(std::vector<const cmSourceFile*>::const_iterator fileIt =
                                                                sFiles.begin();
                fileIt != sFiles.end();
                ++fileIt)
              {
              std::string fullPath = (*fileIt)->GetFullPath();
              if (!cmSystemTools::FileIsDirectory(fullPath))
                {
                std::string linkName4 = linkName3;
                linkName4 += "/";
                linkName4 += cmSystemTools::GetFilenameName(fullPath);
                this->AppendLinkedResource(fout, linkName4,
                                           fullPath, LinkToFile);
                }
              }
            }
          }
          break;
        // ignore all others:
        default:
          break;
        }
      }
    }
}